

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ostringstream *poVar1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_2>_> *pVVar4;
  pointer pcVar5;
  PrecisionCase *pPVar6;
  FloatFormat *fmt;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  long lVar16;
  IVal *pIVar17;
  TestError *this_00;
  uint uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Vector<float,_2> *pVVar20;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar21;
  IVal reference1;
  IVal in2;
  IVal in3;
  FuncSet funcs;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  Environment env;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 *puStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [48];
  string local_4f0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *local_4d0;
  pointer local_4c8;
  PrecisionCase *local_4c0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b8;
  size_t local_4b0;
  Statement *local_4a8;
  ulong local_4a0;
  string local_498;
  undefined1 local_478 [8];
  _Rb_tree_node_base _Stack_470;
  double dStack_450;
  undefined1 auStack_448 [8];
  ResultCollector *local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Rb_tree_node_base *local_418;
  Data DStack_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  pointer local_290;
  FloatFormat *local_288;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  _Rb_tree_node_base *local_188;
  double dStack_180;
  ios_base local_138 [264];
  
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4b0 = (long)pVVar3 - (long)pVVar2 >> 3;
  puStack_530 = (undefined1 *)0x6d9469;
  local_4d0 = variables;
  local_4b8 = inputs;
  local_4a8 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_280,local_4b0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_438 + 8);
  puStack_530 = (undefined1 *)0x6d9512;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  puStack_530 = (undefined1 *)0x6d9526;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Statement: ",0xb);
  puStack_530 = (undefined1 *)0x6d9537;
  (*local_4a8->_vptr_Statement[2])(local_4a8,poVar1);
  puStack_530 = (undefined1 *)0x6d954b;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  puStack_530 = (undefined1 *)0x6d955a;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  puStack_530 = (undefined1 *)0x6d9567;
  std::ios_base::~ios_base(local_3c0);
  puStack_530 = (undefined1 *)0x6d9574;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  _Stack_470._0_8_ = (ulong)(uint)_Stack_470._4_4_ << 0x20;
  _Stack_470._M_parent = (_Base_ptr)0x0;
  dStack_450 = 0.0;
  puStack_530 = (undefined1 *)0x6d95b0;
  local_4c8 = pVVar2;
  _Stack_470._M_left = &_Stack_470;
  _Stack_470._M_right = &_Stack_470;
  (*local_4a8->_vptr_Statement[4])(local_4a8,local_478);
  if (_Stack_470._M_left != &_Stack_470) {
    p_Var11 = _Stack_470._M_left;
    do {
      puStack_530 = (undefined1 *)0x6d95d2;
      (**(code **)(**(long **)(p_Var11 + 1) + 0x30))(*(long **)(p_Var11 + 1),local_1a8);
      puStack_530 = (undefined1 *)0x6d95da;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != &_Stack_470);
  }
  if (dStack_450 != 0.0) {
    local_438._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    puStack_530 = (undefined1 *)0x6d960e;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6d9622;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reference definitions:\n",0x17);
    puStack_530 = (undefined1 *)0x6d9634;
    std::__cxx11::stringbuf::str();
    puStack_530 = (undefined1 *)0x6d9646;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
    puStack_530 = (undefined1 *)0x6d965a;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_520._0_8_ != (IVal *)(local_520 + 0x10)) {
      puStack_530 = (undefined1 *)0x6d9675;
      operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
    }
    puStack_530 = (undefined1 *)0x6d9684;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6d9691;
    std::ios_base::~ios_base(local_3c0);
  }
  puStack_530 = (undefined1 *)0x6d969e;
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_478);
  puStack_530 = (undefined1 *)0x6d96b2;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  puStack_530 = (undefined1 *)0x6d96bf;
  std::ios_base::~ios_base(local_138);
  puStack_530 = (undefined1 *)0x6d96cc;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  puStack_530 = (undefined1 *)0x6d96e5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  puStack_530 = (undefined1 *)0x6d96f2;
  pcVar12 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar12 == (char *)0x0) {
    puStack_530 = (undefined1 *)0x6d9739;
    std::ios::clear((int)&uStack_528 + (int)*(undefined8 *)(local_438._0_8_ + -0x18) + 0xf0);
  }
  else {
    puStack_530 = (undefined1 *)0x6d9702;
    sVar13 = strlen(pcVar12);
    puStack_530 = (undefined1 *)0x6d9715;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar12,sVar13);
  }
  puStack_530 = (undefined1 *)0x6d9752;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  puStack_530 = (undefined1 *)0x6d9767;
  std::__cxx11::stringbuf::str();
  puStack_530 = (undefined1 *)0x6d9782;
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    puStack_530 = (undefined1 *)0x6d97a2;
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  puStack_530 = (undefined1 *)0x6d97b6;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  puStack_530 = (undefined1 *)0x6d97c3;
  std::ios_base::~ios_base(local_3c8);
  puStack_530 = (undefined1 *)0x6d97d1;
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar21 = local_4d0;
  puStack_530 = (undefined1 *)0x6d97dd;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    puStack_530 = (undefined1 *)0x6d980f;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    puStack_530 = (undefined1 *)0x6d9823;
    plVar14 = (long *)std::__cxx11::string::append(local_1a8);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar19) {
      local_428._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_428._8_8_ = plVar14[3];
      local_438._0_8_ = &local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_438._8_8_ = plVar14[1];
    *plVar14 = (long)paVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puStack_530 = (undefined1 *)0x6d9884;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      puStack_530 = (undefined1 *)0x6d989c;
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
    }
    pVVar21 = local_4d0;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      puStack_530 = (undefined1 *)0x6d98be;
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
  }
  puStack_530 = (undefined1 *)0x6d98d0;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  puStack_530 = (undefined1 *)0x6d98e4;
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (pVVar21->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  puStack_530 = (undefined1 *)0x6d98fd;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_438);
  puStack_530 = (undefined1 *)0x6d9914;
  glu::VarType::operator=(&((pointer)(uVar7 + 0x38))->varType,(VarType *)&local_418);
  puStack_530 = (undefined1 *)0x6d991c;
  glu::VarType::~VarType((VarType *)&local_418);
  pVVar21 = local_4d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    puStack_530 = (undefined1 *)0x6d9942;
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  puStack_530 = (undefined1 *)0x6d9955;
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (pVVar21->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  puStack_530 = (undefined1 *)0x6d996d;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  puStack_530 = (undefined1 *)0x6d9984;
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  puStack_530 = (undefined1 *)0x6d998c;
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    puStack_530 = (undefined1 *)0x6d99b1;
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  puStack_530 = (undefined1 *)0x6d99c3;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  puStack_530 = (undefined1 *)0x6d99dc;
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (local_4d0->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._32_8_;
  puStack_530 = (undefined1 *)0x6d99f5;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  puStack_530 = (undefined1 *)0x6d9a0c;
  glu::VarType::operator=(&((pointer)(uVar7 + 0x38))->varType,(VarType *)&local_418);
  puStack_530 = (undefined1 *)0x6d9a14;
  glu::VarType::~VarType((VarType *)&local_418);
  pVVar21 = local_4d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    puStack_530 = (undefined1 *)0x6d9a3e;
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  puStack_530 = (undefined1 *)0x6d9a52;
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (pVVar21->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._32_8_;
  puStack_530 = (undefined1 *)0x6d9a6a;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  puStack_530 = (undefined1 *)0x6d9a81;
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  puStack_530 = (undefined1 *)0x6d9a89;
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    puStack_530 = (undefined1 *)0x6d9aae;
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  puStack_530 = (undefined1 *)0x6d9abb;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  puStack_530 = (undefined1 *)0x6d9ad1;
  (*local_4a8->_vptr_Statement[2])(local_4a8,local_438);
  puStack_530 = (undefined1 *)0x6d9ae6;
  std::__cxx11::stringbuf::str();
  puStack_530 = (undefined1 *)0x6d9b02;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  puStack_530 = (undefined1 *)0x6d9b0f;
  std::ios_base::~ios_base(local_3c8);
  puStack_530 = (undefined1 *)0x6d9b22;
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    puStack_530 = (undefined1 *)0x6d9b3a;
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  puStack_530 = (undefined1 *)0x6d9b57;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_438._0_8_ =
       (local_4b8->in0).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_4b8->in1).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_4b8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_4b8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_280.out0.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_280.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  puStack_530 = (undefined1 *)0x6d9bc0;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  puStack_530 = (undefined1 *)0x6d9bc9;
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    puStack_530 = (undefined1 *)0x6da9bb;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    puStack_530 = (undefined1 *)0x6da9dc;
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    puStack_530 = &LAB_006da9f2;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puStack_530 = (undefined1 *)0x6d9bda;
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  puStack_530 = (undefined1 *)0x6d9bf8;
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,local_4b0,local_438,local_1a8);
  local_288 = &(this->m_ctx).floatFormat;
  puStack_530 = (undefined1 *)0x6d9c16;
  local_4c0 = this;
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  pVVar21 = local_4d0;
  lVar16 = 0x10;
  do {
    auStack_448[lVar16] = 0;
    *(undefined8 *)((long)&local_440 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    auStack_448[lVar16] = 0;
    *(undefined8 *)((long)&local_440 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    local_1b8._M_local_buf[lVar16] = '\0';
    *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    local_1b8._M_local_buf[lVar16] = '\0';
    *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    local_478[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_478 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_478 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    local_478[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_478 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_478 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&puStack_530 + lVar16) = 0;
    *(undefined8 *)((long)&uStack_528 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_520 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&puStack_530 + lVar16) = 0;
    *(undefined8 *)((long)&uStack_528 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_520 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  puStack_530 = (undefined1 *)0x6d9d6b;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (pVVar21->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_438);
  puStack_530 = (undefined1 *)0x6d9d84;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (pVVar21->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  puStack_530 = (undefined1 *)0x6d9d9a;
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (pVVar21->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4f0);
  puStack_530 = (undefined1 *)0x6d9db3;
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (pVVar21->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_498);
  puStack_530 = (undefined1 *)0x6d9dcc;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (pVVar21->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_478);
  puStack_530 = (undefined1 *)0x6d9de2;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (pVVar21->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_520);
  if (pVVar3 == local_4c8) {
    local_4a0 = 0;
  }
  else {
    local_440 = &local_4c0->m_status;
    local_290 = (pointer)(local_4b0 + (local_4b0 == 0));
    local_4c8 = (pointer)0x0;
    local_4a0 = 0;
    do {
      lVar16 = 0x10;
      do {
        local_1b8._M_local_buf[lVar16] = '\0';
        *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x40);
      lVar16 = 0x10;
      do {
        local_1b8._M_local_buf[lVar16] = '\0';
        *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 == 0x28);
      lVar16 = 0x10;
      do {
        local_478[lVar16 + -0x10] = 0;
        *(undefined8 *)(local_478 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_478 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x40);
      lVar16 = 0x10;
      do {
        local_478[lVar16 + -0x10] = 0;
        *(undefined8 *)(local_478 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_478 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 == 0x28);
      if (((ulong)local_4c8 & 0xfff) == 0) {
        puStack_530 = (undefined1 *)0x6d9edf;
        tcu::TestContext::touchWatchdog((local_4c0->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_288;
      local_4f0._M_dataplus._M_p =
           *(pointer *)
            (local_4b8->in0).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4c8].m_data;
      puStack_530 = (undefined1 *)0x6d9f0f;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_520,local_288,(Vector<float,_2> *)&local_4f0);
      pVVar21 = local_4d0;
      puStack_530 = (undefined1 *)0x6d9f31;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_520);
      puStack_530 = (undefined1 *)0x6d9f3c;
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (pVVar21->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = (double)local_418;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      pIVar17->m_data[0].m_hi = (double)local_428._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = local_428._8_8_;
      *(undefined8 *)pIVar17->m_data = local_438._0_8_;
      pIVar17->m_data[0].m_lo = (double)local_438._8_8_;
      local_4f0._M_dataplus._M_p =
           *(pointer *)
            (local_4b8->in1).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4c8].m_data;
      puStack_530 = (undefined1 *)0x6d9f88;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_520,fmt,(Vector<float,_2> *)&local_4f0);
      puStack_530 = (undefined1 *)0x6d9f9d;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_520);
      puStack_530 = (undefined1 *)0x6d9fa9;
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (pVVar21->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = (double)local_418;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      pIVar17->m_data[0].m_hi = (double)local_428._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = local_428._8_8_;
      *(undefined8 *)pIVar17->m_data = local_438._0_8_;
      pIVar17->m_data[0].m_lo = (double)local_438._8_8_;
      puStack_530 = (undefined1 *)0x6d9fd8;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar21->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      puStack_530 = (undefined1 *)0x6d9fe4;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar21->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_410.basic.type = (local_4c0->m_ctx).precision;
      local_418 = (_Rb_tree_node_base *)fmt->m_maxValue;
      local_438._0_8_ = *(undefined8 *)fmt;
      local_438._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_428._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_400 = 0;
      puStack_530 = (undefined1 *)0x6da047;
      DStack_410._8_8_ = &local_250;
      (*local_4a8->_vptr_Statement[3])(local_4a8,local_438);
      puStack_530 = (undefined1 *)0x6da053;
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (pVVar21->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      puStack_530 = (undefined1 *)0x6da06b;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar17);
      pVVar2 = local_4c8;
      dStack_450 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      _Stack_470._M_right = local_418;
      _Stack_470._M_parent = (_Base_ptr)local_428._M_allocated_capacity;
      _Stack_470._M_left = (_Base_ptr)local_428._8_8_;
      local_478 = (undefined1  [8])local_438._0_8_;
      _Stack_470._0_8_ = local_438._8_8_;
      puStack_530 = (undefined1 *)0x6da0c0;
      bVar8 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                        ((IVal *)local_478,
                         local_280.out1.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)local_4c8);
      local_438._0_8_ = &local_428;
      puStack_530 = (undefined1 *)0x6da0f1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      puStack_530 = (undefined1 *)0x6da105;
      bVar8 = tcu::ResultCollector::check(local_440,bVar8,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        puStack_530 = (undefined1 *)0x6da135;
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
      }
      puStack_530 = (undefined1 *)0x6da146;
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (local_4d0->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      puStack_530 = (undefined1 *)0x6da15e;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar17);
      dStack_180 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      local_188 = local_418;
      local_1a8._16_8_ = local_428._M_allocated_capacity;
      local_1a8._24_8_ = local_428._8_8_;
      local_1a8._0_8_ = local_438._0_8_;
      local_1a8._8_8_ = local_438._8_8_;
      puStack_530 = (undefined1 *)0x6da1a6;
      bVar9 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                        ((IVal *)local_1a8,
                         local_280.out0.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2);
      local_438._0_8_ = &local_428;
      puStack_530 = (undefined1 *)0x6da1d7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      puStack_530 = (undefined1 *)0x6da1eb;
      bVar9 = tcu::ResultCollector::check(local_440,bVar9,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        puStack_530 = (undefined1 *)0x6da213;
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
      }
      uVar18 = (int)local_4a0 + ((byte)~(bVar8 && bVar9) & 1);
      local_4a0 = (ulong)uVar18;
      poVar1 = (ostringstream *)(local_438 + 8);
      if ((int)uVar18 < 0x65 && (!bVar8 || !bVar9)) {
        local_438._0_8_ = ((local_4c0->super_TestCase).super_TestNode.m_testCtx)->m_log;
        puStack_530 = (undefined1 *)0x6da269;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        pcVar12 = "Failed";
        if (bVar8 && bVar9) {
          pcVar12 = "Passed";
        }
        puStack_530 = (undefined1 *)0x6da28c;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar12,6);
        pVVar21 = local_4d0;
        puStack_530 = (undefined1 *)0x6da2a5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," sample:\n",9);
        puStack_530 = (undefined1 *)0x6da2b9;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (pVVar21->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pVVar20 = (Vector<float,_2> *)(local_520 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        puStack_530 = (undefined1 *)0x6da2db;
        local_520._0_8_ = pVVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        puStack_530 = (undefined1 *)0x6da2ed;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        puStack_530 = (undefined1 *)0x6da301;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        puStack_530 = (undefined1 *)0x6da31e;
        valueToString<tcu::Vector<float,2>>
                  (&local_4f0,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((local_4b8->in0).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2),pVVar20);
        puStack_530 = (undefined1 *)0x6da330;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        puStack_530 = (undefined1 *)0x6da344;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          puStack_530 = (undefined1 *)0x6da360;
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_520._0_8_ != (Vector<float,_2> *)(local_520 + 0x10)) {
          puStack_530 = (undefined1 *)0x6da37c;
          operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
        }
        puStack_530 = (undefined1 *)0x6da390;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (pVVar21->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pVVar20 = (Vector<float,_2> *)(local_520 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        puStack_530 = (undefined1 *)0x6da3b3;
        local_520._0_8_ = pVVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        puStack_530 = (undefined1 *)0x6da3c5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        puStack_530 = (undefined1 *)0x6da3d9;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        puStack_530 = (undefined1 *)0x6da3f7;
        valueToString<tcu::Vector<float,2>>
                  (&local_4f0,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((local_4b8->in1).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2),pVVar20);
        puStack_530 = (undefined1 *)0x6da409;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        puStack_530 = (undefined1 *)0x6da41d;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          puStack_530 = (undefined1 *)0x6da439;
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_520._0_8_ != (Vector<float,_2> *)(local_520 + 0x10)) {
          puStack_530 = (undefined1 *)0x6da455;
          operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
        }
        puStack_530 = (undefined1 *)0x6da469;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (pVVar21->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pIVar17 = (IVal *)(local_520 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        puStack_530 = (undefined1 *)0x6da48c;
        local_520._0_8_ = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        puStack_530 = (undefined1 *)0x6da49e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        puStack_530 = (undefined1 *)0x6da4b2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        puStack_530 = (undefined1 *)0x6da4cf;
        valueToString<tcu::Vector<float,2>>
                  (&local_4f0,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   (local_280.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2),
                   (Vector<float,_2> *)pIVar17);
        puStack_530 = (undefined1 *)0x6da4e1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        puStack_530 = (undefined1 *)0x6da4f5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        puStack_530 = (undefined1 *)0x6da509;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        puStack_530 = (undefined1 *)0x6da526;
        intervalToString<tcu::Vector<float,2>>
                  (&local_498,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar17);
        puStack_530 = (undefined1 *)0x6da53e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_498._M_dataplus._M_p,local_498._M_string_length);
        puStack_530 = (undefined1 *)0x6da552;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          puStack_530 = (undefined1 *)0x6da577;
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          puStack_530 = (undefined1 *)0x6da593;
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)(local_520 + 0x10)) {
          puStack_530 = (undefined1 *)0x6da5af;
          operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
        }
        puStack_530 = (undefined1 *)0x6da5c3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (pVVar21->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pIVar17 = (IVal *)(local_520 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        puStack_530 = (undefined1 *)0x6da5e6;
        local_520._0_8_ = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        puStack_530 = (undefined1 *)0x6da5f8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_520._0_8_,local_520._8_8_);
        puStack_530 = (undefined1 *)0x6da60c;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        puStack_530 = (undefined1 *)0x6da629;
        valueToString<tcu::Vector<float,2>>
                  (&local_4f0,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   (local_280.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2),
                   (Vector<float,_2> *)pIVar17);
        puStack_530 = (undefined1 *)0x6da63b;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        puStack_530 = (undefined1 *)0x6da64f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        puStack_530 = (undefined1 *)0x6da663;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        puStack_530 = (undefined1 *)0x6da680;
        intervalToString<tcu::Vector<float,2>>
                  (&local_498,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_478,pIVar17);
        puStack_530 = (undefined1 *)0x6da698;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_498._M_dataplus._M_p,local_498._M_string_length);
        puStack_530 = (undefined1 *)0x6da6ac;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          puStack_530 = (undefined1 *)0x6da6d1;
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          puStack_530 = (undefined1 *)0x6da6ed;
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)(local_520 + 0x10)) {
          puStack_530 = (undefined1 *)0x6da709;
          operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
        }
        puStack_530 = (undefined1 *)0x6da71d;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        puStack_530 = (undefined1 *)0x6da72c;
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        puStack_530 = (undefined1 *)0x6da739;
        std::ios_base::~ios_base(local_3c0);
      }
      local_4c8 = (pointer)((long)local_4c8->m_data + 1);
    } while (local_4c8 != local_290);
  }
  pPVar6 = local_4c0;
  iVar10 = (int)local_4a0;
  if (100 < iVar10) {
    local_438._0_8_ = ((local_4c0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    puStack_530 = (undefined1 *)0x6da795;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6da7a9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(Skipped ",9);
    puStack_530 = (undefined1 *)0x6da7b5;
    std::ostream::operator<<(poVar1,iVar10 + -100);
    puStack_530 = (undefined1 *)0x6da7c9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," messages.)",0xb);
    puStack_530 = (undefined1 *)0x6da7dd;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    puStack_530 = (undefined1 *)0x6da7ec;
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6da7f9;
    std::ios_base::~ios_base(local_3c0);
  }
  if (iVar10 == 0) {
    local_438._0_8_ = ((pPVar6->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    puStack_530 = (undefined1 *)0x6da88c;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6da8a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
    puStack_530 = (undefined1 *)0x6da8ad;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    puStack_530 = (undefined1 *)0x6da8c1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs passed.",0xf);
    puStack_530 = (undefined1 *)0x6da8d5;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_438._0_8_ = ((pPVar6->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    puStack_530 = (undefined1 *)0x6da81a;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    puStack_530 = (undefined1 *)0x6da825;
    std::ostream::operator<<(poVar1,iVar10);
    puStack_530 = (undefined1 *)0x6da839;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
    puStack_530 = (undefined1 *)0x6da846;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    puStack_530 = (undefined1 *)0x6da85a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs failed.",0xf);
    puStack_530 = (undefined1 *)0x6da86e;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  puStack_530 = (undefined1 *)0x6da8e4;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_438 + 8));
  puStack_530 = (undefined1 *)0x6da8f1;
  std::ios_base::~ios_base(local_3c0);
  puStack_530 = (undefined1 *)0x6da8fe;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    puStack_530 = (undefined1 *)0x6da92b;
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    puStack_530 = (undefined1 *)0x6da950;
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  puStack_530 = (undefined1 *)0x6da958;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  puStack_530 = (undefined1 *)0x6da965;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_280.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    puStack_530 = (undefined1 *)0x6da982;
    operator_delete(local_280.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.out0.
         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    puStack_530 = (undefined1 *)0x6da99f;
    operator_delete(local_280.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}